

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O1

void cfd::TransactionContextUtil::AddPubkeyHashSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               SignParameter *signature,Pubkey *pubkey,AddressType address_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  SignDataType SVar5;
  CfdException *pCVar6;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> scriptsig;
  Script locking_script;
  AddressType local_11c;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_118;
  SignParameter local_100;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_88;
  Script local_68;
  
  local_11c = address_type;
  SVar5 = SignParameter::GetDataType(signature);
  if (SVar5 != kSign) {
    SVar5 = SignParameter::GetDataType(signature);
    if (SVar5 != kBinary) {
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 100;
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
      local_68._vptr_Script._0_4_ = SignParameter::GetDataType(signature);
      core::logger::log<cfd::SignDataType&>
                ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,
                 "Failed to AddPubkeyHashSign. Invalid signature type: {}",(SignDataType *)&local_68
                );
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&local_100.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,
                 "Invalid signature type. signature type must be \"kSign\" or \"kBinary\".","");
      core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
  }
  cVar4 = cfd::core::Pubkey::IsValid();
  if (cVar4 != '\0') {
    cVar4 = cfd::core::OutPoint::IsValid();
    if (cVar4 == '\0') {
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x71;
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
      core::logger::log<>((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,
                          "Failed to AddPubkeyHashSign. Invalid outpoint.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&local_100.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Invalid outpoint.","");
      core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::Script::Script(&local_68);
    local_118.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_11c == kP2pkhAddress) {
      bVar3 = true;
      bVar2 = false;
    }
    else if (local_11c == kP2wpkhAddress) {
      bVar2 = true;
      bVar3 = false;
    }
    else {
      if (local_11c != kP2shP2wpkhAddress) {
        local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
        local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x88;
        local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
        core::logger::log<cfd::core::AddressType&>
                  ((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,
                   "Failed to AddPubkeyHashSign. Invalid address_type: {}",&local_11c);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&local_100.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_100,
                   "Invalid address_type. address_type must be \"p2wpkh\" or \"p2sh-p2wpkh\" or \"p2pkh\"."
                   ,"");
        core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)&local_100);
      cfd::core::Script::operator=(&local_68,(Script *)&local_100);
      core::Script::~Script((Script *)&local_100);
      bVar2 = true;
      bVar3 = true;
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
              (&local_118,signature);
    SignParameter::SignParameter(&local_100,pubkey);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
    emplace_back<cfd::SignParameter>(&local_118,&local_100);
    paVar1 = &local_100.op_code_.text_data_.field_2;
    local_100.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.op_code_.text_data_._M_dataplus._M_p != paVar1) {
      operator_delete(local_100.op_code_.text_data_._M_dataplus._M_p);
    }
    if (local_100.related_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.related_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar2) {
      AddSign<cfd::ConfidentialTransactionContext>(transaction,outpoint,&local_118,true,true);
    }
    if (bVar3) {
      cVar4 = cfd::core::Script::IsEmpty();
      if (cVar4 == '\0') {
        local_88.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SignParameter::SignParameter(&local_100,&local_68);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
        emplace_back<cfd::SignParameter>(&local_88,&local_100);
        local_100.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100.op_code_.text_data_._M_dataplus._M_p != paVar1) {
          operator_delete(local_100.op_code_.text_data_._M_dataplus._M_p);
        }
        if (local_100.related_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.related_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_100.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        AddSign<cfd::ConfidentialTransactionContext>(transaction,outpoint,&local_88,false,true);
        std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_88);
      }
      else {
        AddSign<cfd::ConfidentialTransactionContext>(transaction,outpoint,&local_118,false,true);
      }
    }
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_118);
    core::Script::~Script(&local_68);
    return;
  }
  local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfd_transaction_internal.cpp";
  local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x6d;
  local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "AddPubkeyHashSign";
  core::logger::log<>((CfdSourceLocation *)&local_100,kCfdLogLevelWarning,
                      "Failed to AddPubkeyHashSign. Invalid pubkey.");
  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
  local_100.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_100.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Invalid pubkey.","");
  core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&local_100);
  __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContextUtil::AddPubkeyHashSign(
    Tx* transaction, const OutPoint& outpoint, const SignParameter& signature,
    const Pubkey& pubkey, AddressType address_type) {
  if ((signature.GetDataType() != SignDataType::kSign) &&
      (signature.GetDataType() != SignDataType::kBinary)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to AddPubkeyHashSign. Invalid signature type: {}",
        signature.GetDataType());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid signature type. signature type must be \"kSign\" "
        "or \"kBinary\".");  // NOLINT
  }
  if (!pubkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid pubkey.");
    throw CfdException(CfdError::kCfdIllegalArgumentError, "Invalid pubkey.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddPubkeyHashSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_witness = false;
  bool has_scriptsig = false;
  Script locking_script;
  std::vector<SignParameter> sign_params;
  switch (address_type) {
    case AddressType::kP2wpkhAddress:
      has_witness = true;
      break;
    case AddressType::kP2shP2wpkhAddress:
      has_witness = true;
      has_scriptsig = true;
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      break;
    case AddressType::kP2pkhAddress:
      has_scriptsig = true;
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to AddPubkeyHashSign. Invalid address_type: {}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2wpkh\" "
          "or \"p2sh-p2wpkh\" or \"p2pkh\".");  // NOLINT
  }
  sign_params.push_back(signature);
  sign_params.push_back(SignParameter(pubkey));

  if (has_witness) {
    AddSign(transaction, outpoint, sign_params, true, true);
  }
  if (has_scriptsig) {
    if (!locking_script.IsEmpty()) {  // p2sh-p2wpkh
      std::vector<SignParameter> scriptsig;
      scriptsig.push_back(SignParameter(locking_script));
      AddSign(transaction, outpoint, scriptsig, false, true);
    } else {
      AddSign(transaction, outpoint, sign_params, false, true);
    }
  }
}